

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall Js::JavascriptNativeIntArray::ValidateArray(JavascriptNativeIntArray *this)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase **ppSVar3;
  ScriptContext *this_00;
  Recycler *recycler;
  undefined4 *puVar4;
  SparseArraySegment<int> *seg_00;
  SparseArraySegmentBase *local_18;
  SparseArraySegmentBase *seg;
  JavascriptNativeIntArray *this_local;
  
  if ((Configuration::Global & 1) == 0) {
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptNativeArray).super_JavascriptArray.head);
    local_18 = *ppSVar3;
    while (local_18 != (SparseArraySegmentBase *)0x0) {
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&local_18->next);
      if (*ppSVar3 != (SparseArraySegmentBase *)0x0) {
        this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        recycler = ScriptContext::GetRecycler(this_00);
        bVar2 = SparseArraySegmentBase::IsLeafSegment(local_18,recycler);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2e89,
                                      "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))"
                                      ,"Leaf segment with a next pointer");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&local_18->next);
      local_18 = *ppSVar3;
    }
  }
  else {
    Js::JavascriptArray::ValidateArrayCommon((JavascriptArray *)this);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(this->super_JavascriptNativeArray).super_JavascriptArray.head);
    seg_00 = SparseArraySegment<int>::From(*ppSVar3);
    Js::JavascriptArray::ValidateSegment<int>(seg_00);
  }
  return;
}

Assistant:

void JavascriptNativeIntArray::ValidateArray()
    {
        if (!Js::Configuration::Global.flags.ArrayValidate)
        {
#if DBG
            SparseArraySegmentBase *seg = head;
            while (seg)
            {
                if (seg->next != nullptr)
                {
                    AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
                }
                seg = seg->next;
            }
#endif
            return;
        }
        ValidateArrayCommon();
        // Detailed segments validation
        JavascriptArray::ValidateSegment<int32>(SparseArraySegment<int32>::From(head));
    }